

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O0

void duckdb::UnaryExecutor::
     ExecuteStandard<long,long,duckdb::UnaryOperatorWrapper,duckdb::BitwiseNotOperator>
               (Vector *input,Vector *result,idx_t count,void *dataptr,bool adds_nulls,
               FunctionErrors errors)

{
  VectorType VVar1;
  bool bVar2;
  long lVar3;
  idx_t iVar4;
  long *result_data_00;
  SelectionVector *pSVar5;
  ValidityMask *pVVar6;
  long *plVar7;
  ValidityMask *pVVar8;
  UnifiedVectorFormat *in_RDX;
  Vector *in_RSI;
  Vector *in_RDI;
  byte in_R8B;
  char in_R9B;
  uint uVar9;
  long *ldata_3;
  long *result_data_3;
  UnifiedVectorFormat vdata;
  SelectionVector *offsets;
  long *ldata_2;
  long *result_data_2;
  Vector *dictionary_values;
  optional_idx dict_size;
  long *ldata_1;
  long *result_data_1;
  long *ldata;
  long *result_data;
  Vector *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  ValidityMask *in_stack_fffffffffffffe68;
  long in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe90;
  undefined1 uVar10;
  undefined1 *count_00;
  void *in_stack_fffffffffffffe98;
  ValidityMask *in_stack_fffffffffffffea0;
  UnifiedVectorFormat *this;
  ValidityMask *in_stack_fffffffffffffea8;
  void *in_stack_fffffffffffffeb0;
  long *in_stack_fffffffffffffeb8;
  long *in_stack_fffffffffffffec0;
  SelectionVector *local_b8 [2];
  undefined1 local_a8 [56];
  SelectionVector *local_70;
  ValidityMask *local_68;
  long *local_60;
  Vector *local_58;
  optional_idx local_50;
  long *local_48;
  long *local_40;
  long *local_38;
  long *local_30;
  char local_22;
  byte local_21;
  UnifiedVectorFormat *local_18;
  Vector *local_10;
  Vector *local_8;
  
  uVar10 = (undefined1)((ulong)in_stack_fffffffffffffe90 >> 0x38);
  local_21 = in_R8B & 1;
  local_22 = in_R9B;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  VVar1 = Vector::GetVectorType(in_RDI);
  if (VVar1 == FLAT_VECTOR) {
    duckdb::Vector::SetVectorType((VectorType)local_10);
    local_40 = FlatVector::GetData<long>((Vector *)0xe67624);
    local_48 = FlatVector::GetData<long>((Vector *)0xe67639);
    FlatVector::Validity((Vector *)0xe6767e);
    FlatVector::Validity((Vector *)0xe67693);
    ExecuteFlat<long,long,duckdb::UnaryOperatorWrapper,duckdb::BitwiseNotOperator>
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,(idx_t)in_stack_fffffffffffffeb0,
               in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
               (bool)uVar10);
  }
  else if (VVar1 == CONSTANT_VECTOR) {
    duckdb::Vector::SetVectorType((VectorType)local_10);
    local_30 = ConstantVector::GetData<long>((Vector *)0xe67566);
    local_38 = ConstantVector::GetData<long>((Vector *)0xe6757b);
    bVar2 = ConstantVector::IsNull((Vector *)0xe67590);
    if (bVar2) {
      duckdb::ConstantVector::SetNull(local_10,true);
    }
    else {
      duckdb::ConstantVector::SetNull(local_10,false);
      ConstantVector::Validity(local_10);
      lVar3 = UnaryOperatorWrapper::Operation<duckdb::BitwiseNotOperator,long,long>
                        (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                         CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                         in_stack_fffffffffffffe58);
      *local_30 = lVar3;
    }
  }
  else {
    if ((VVar1 == DICTIONARY_VECTOR) && (local_22 == '\0')) {
      local_50 = DictionaryVector::DictionarySize(in_stack_fffffffffffffe58);
      bVar2 = optional_idx::IsValid(&local_50);
      if ((bVar2) &&
         (iVar4 = optional_idx::GetIndex((optional_idx *)in_stack_fffffffffffffea0),
         (UnifiedVectorFormat *)(iVar4 * 2) < local_18 || (long)(iVar4 * 2) - (long)local_18 == 0))
      {
        local_58 = DictionaryVector::Child((Vector *)0xe6773b);
        VVar1 = Vector::GetVectorType(local_58);
        if (VVar1 == FLAT_VECTOR) {
          local_60 = FlatVector::GetData<long>((Vector *)0xe67765);
          pVVar6 = (ValidityMask *)FlatVector::GetData<long>((Vector *)0xe6777a);
          plVar7 = local_60;
          local_68 = pVVar6;
          result_data_00 = (long *)optional_idx::GetIndex((optional_idx *)in_stack_fffffffffffffea0)
          ;
          pVVar8 = FlatVector::Validity((Vector *)0xe677bb);
          FlatVector::Validity((Vector *)0xe677cd);
          ExecuteFlat<long,long,duckdb::UnaryOperatorWrapper,duckdb::BitwiseNotOperator>
                    ((long *)pVVar8,result_data_00,(idx_t)plVar7,pVVar6,in_stack_fffffffffffffea0,
                     in_stack_fffffffffffffe98,(bool)uVar10);
          local_70 = DictionaryVector::SelVector((Vector *)0xe6780d);
          pSVar5 = (SelectionVector *)
                   optional_idx::GetIndex((optional_idx *)in_stack_fffffffffffffea0);
          duckdb::Vector::Dictionary(local_10,(ulong)local_10,pSVar5,(ulong)local_70);
          return;
        }
      }
    }
    this = (UnifiedVectorFormat *)local_b8;
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat(this);
    duckdb::Vector::ToUnifiedFormat((ulong)local_8,local_18);
    duckdb::Vector::SetVectorType((VectorType)local_10);
    pVVar6 = (ValidityMask *)FlatVector::GetData<long>((Vector *)0xe678b5);
    plVar7 = UnifiedVectorFormat::GetData<long>((UnifiedVectorFormat *)local_b8);
    uVar10 = (undefined1)((ulong)plVar7 >> 0x38);
    count_00 = local_a8;
    pVVar8 = FlatVector::Validity((Vector *)0xe67920);
    uVar9 = local_21 & 1;
    ExecuteLoop<long,long,duckdb::UnaryOperatorWrapper,duckdb::BitwiseNotOperator>
              ((long *)this,(long *)pVVar8,(idx_t)count_00,local_b8[0],(ValidityMask *)local_18,
               pVVar6,in_stack_fffffffffffffeb0,(bool)uVar10);
    UnifiedVectorFormat::~UnifiedVectorFormat
              ((UnifiedVectorFormat *)CONCAT44(in_stack_fffffffffffffe64,uVar9));
  }
  return;
}

Assistant:

static inline void ExecuteStandard(Vector &input, Vector &result, idx_t count, void *dataptr, bool adds_nulls,
	                                   FunctionErrors errors = FunctionErrors::CAN_THROW_RUNTIME_ERROR) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);
			auto ldata = ConstantVector::GetData<INPUT_TYPE>(input);

			if (ConstantVector::IsNull(input)) {
				ConstantVector::SetNull(result, true);
			} else {
				ConstantVector::SetNull(result, false);
				*result_data = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
				    *ldata, ConstantVector::Validity(result), 0, dataptr);
			}
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = FlatVector::GetData<INPUT_TYPE>(input);

			ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, FlatVector::Validity(input),
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		case VectorType::DICTIONARY_VECTOR: {
			// dictionary vector - we can run the function ONLY on the dictionary in some cases
			// we can only do this if the function does not throw errors
			// we can execute the function on a value that is in the dictionary but that is not referenced
			// if the function can throw errors - this will result in us (incorrectly) throwing an error
			if (errors == FunctionErrors::CANNOT_ERROR) {
				static constexpr idx_t DICTIONARY_THRESHOLD = 2;
				auto dict_size = DictionaryVector::DictionarySize(input);
				if (dict_size.IsValid() && dict_size.GetIndex() * DICTIONARY_THRESHOLD <= count) {
					// we can operate directly on the dictionary if we have a dictionary size
					// but this only makes sense if the dictionary size is smaller than the count by some factor
					auto &dictionary_values = DictionaryVector::Child(input);
					if (dictionary_values.GetVectorType() == VectorType::FLAT_VECTOR) {
						// execute the function over the dictionary
						auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
						auto ldata = FlatVector::GetData<INPUT_TYPE>(dictionary_values);
						ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(
						    ldata, result_data, dict_size.GetIndex(), FlatVector::Validity(dictionary_values),
						    FlatVector::Validity(result), dataptr, adds_nulls);
						// slice the result with the original offsets
						auto &offsets = DictionaryVector::SelVector(input);
						result.Dictionary(result, dict_size.GetIndex(), offsets, count);
						break;
					}
				}
			}
			DUCKDB_EXPLICIT_FALLTHROUGH;
		}
#endif
		default: {
			UnifiedVectorFormat vdata;
			input.ToUnifiedFormat(count, vdata);

			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = UnifiedVectorFormat::GetData<INPUT_TYPE>(vdata);

			ExecuteLoop<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, vdata.sel, vdata.validity,
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		}
	}